

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# SRBMemoryAllocator.cpp
# Opt level: O3

void __thiscall Diligent::SRBMemoryAllocator::~SRBMemoryAllocator(SRBMemoryAllocator *this)

{
  uint uVar1;
  FixedBlockMemoryAllocator *pFVar2;
  long lVar3;
  
  pFVar2 = this->m_DataAllocators;
  if (pFVar2 != (FixedBlockMemoryAllocator *)0x0) {
    uVar1 = this->m_ResourceCacheDataAllocatorCount + this->m_ShaderVariableDataAllocatorCount;
    if (uVar1 != 0) {
      lVar3 = 0;
      do {
        FixedBlockMemoryAllocator::~FixedBlockMemoryAllocator
                  ((FixedBlockMemoryAllocator *)
                   ((long)&(this->m_DataAllocators->super_IMemoryAllocator)._vptr_IMemoryAllocator +
                   lVar3));
        lVar3 = lVar3 + 0x130;
      } while ((ulong)uVar1 * 0x130 - lVar3 != 0);
      pFVar2 = this->m_DataAllocators;
    }
    (*this->m_RawMemAllocator->_vptr_IMemoryAllocator[1])(this->m_RawMemAllocator,pFVar2);
  }
  return;
}

Assistant:

SRBMemoryAllocator::~SRBMemoryAllocator()
{
    if (m_DataAllocators != nullptr)
    {
        auto TotalAllocatorCount = m_ShaderVariableDataAllocatorCount + m_ResourceCacheDataAllocatorCount;
        for (Uint32 s = 0; s < TotalAllocatorCount; ++s)
        {
            m_DataAllocators[s].~FixedBlockMemoryAllocator();
        }
        m_RawMemAllocator.Free(m_DataAllocators);
    }
}